

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  void *unaff_R12;
  void *unaff_R13;
  void *local_140;
  location *local_100;
  void *local_e0;
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  uVar1 = __cxa_rethrow();
  if (local_140 != unaff_R12) {
    operator_delete(local_140);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_100 != where) {
    operator_delete(local_100);
  }
  if (local_e0 != unaff_R13) {
    operator_delete(local_e0);
  }
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}